

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

void __thiscall QTapAndHoldGesture::QTapAndHoldGesture(QTapAndHoldGesture *this,QObject *parent)

{
  QTapAndHoldGesturePrivate *this_00;
  
  this_00 = (QTapAndHoldGesturePrivate *)operator_new(0xc0);
  QTapAndHoldGesturePrivate::QTapAndHoldGesturePrivate(this_00);
  QGesture::QGesture(&this->super_QGesture,(QGesturePrivate *)this_00,parent);
  *(undefined ***)&this->super_QGesture = &PTR_metaObject_007c0050;
  *(undefined4 *)(*(long *)&(this->super_QGesture).field_0x8 + 0x78) = 2;
  return;
}

Assistant:

QTapAndHoldGesture::QTapAndHoldGesture(QObject *parent)
    : QGesture(*new QTapAndHoldGesturePrivate, parent)
{
    d_func()->gestureType = Qt::TapAndHoldGesture;
}